

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_socket_unix.cxx
# Opt level: O3

int ndiSocketRead(NDISocketHandle socket,char *reply,int numberOfBytesToRead,bool isBinary,
                 int *outErrorCode)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __n;
  
  __n = (size_t)numberOfBytesToRead;
  uVar3 = 0;
  do {
    uVar2 = recv(socket,reply + (uVar3 & 0xffffffff),__n,0);
    if ((int)uVar2 < 1) {
      uVar3 = 0xffffffff;
      break;
    }
    uVar3 = (uVar2 & 0xffffffff) + (uVar3 & 0xffffffff);
    if (isBinary) {
      iVar1 = strncmp(reply,"ERROR",5);
      if ((iVar1 == 0) && (reply[uVar3 - 1] == '\r')) break;
      if ((*reply == -0x3c) && (reply[1] == -0x5b)) {
        numberOfBytesToRead = (int)(ushort)(*(short *)(reply + 2) + 8);
      }
    }
    else if (reply[uVar3 - 1] == '\r') break;
  } while ((uint)uVar3 != numberOfBytesToRead);
  return (int)uVar3;
}

Assistant:

ndicapiExport int ndiSocketRead(NDISocketHandle socket, char* reply, int numberOfBytesToRead, bool isBinary, int* outErrorCode)
{
  int totalNumberOfBytesRead = 0;
  int totalNumberOfBytesToRead = numberOfBytesToRead;
  int numberOfBytesRead;
  bool binarySizeCalculated = false;

  do
  {
    numberOfBytesRead = recv(socket, reply + totalNumberOfBytesRead, numberOfBytesToRead, 0);

    if (numberOfBytesRead < 1)
    {
      return -1;
    }

    totalNumberOfBytesRead += numberOfBytesRead;
    if (!isBinary && reply[totalNumberOfBytesRead - 1] == '\r'       /* done when carriage return received (ASCII) or when ERROR... received (binary)*/
        || isBinary && strncmp(reply, "ERROR", 5) == 0 && reply[totalNumberOfBytesRead - 1] == '\r')
    {
      break;
    }

    if (isBinary && !binarySizeCalculated && reply[0] == (char)0xc4 && reply[1] == (char)0xa5)
    {
      // recalculate n based on the reply length (reported from ndi device) and the amount of data received so far
      unsigned short size = ((unsigned char)reply[2] | (unsigned char)reply[3] << 8) + 8; // 8 bytes -> 2 for Start Sequence (a5c4), 2 for reply length, 2 for header CRC, 2 for CRC16
      totalNumberOfBytesToRead = size;
    }
  }
  while (totalNumberOfBytesRead != totalNumberOfBytesToRead);

  return totalNumberOfBytesRead;
}